

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O2

uchar * mcmffh(mcmcx1def *ctx,uchar *p)

{
  ushort uVar1;
  
  while( true ) {
    uVar1 = *(ushort *)p;
    if (uVar1 == 0xffff) {
      return (uchar *)0x0;
    }
    if ((ctx->mcmcxtab[uVar1 >> 8][(byte)uVar1].mcmoflg & 0x80) != 0) break;
    p = (uchar *)((long)p + (ulong)ctx->mcmcxtab[uVar1 >> 8][(byte)uVar1].mcmosiz + 8);
  }
  return (uchar *)(ushort *)p;
}

Assistant:

static uchar *mcmffh(mcmcx1def *ctx, uchar *p)
{
    mcmodef *o;

    MCMGLBCTX(ctx);

    while (*(mcmon *)p != MCMONINV)
    {
        o = mcmgobje(ctx, *(mcmon *)p);
        assert(o->mcmoptr == p + osrndsz(sizeof(mcmon)));
        if (o->mcmoflg & MCMOFFREE) return(p);
        p += osrndsz(sizeof(mcmon)) + o->mcmosiz;  /* move on to next chunk */
    }
    return((uchar *)0);                      /* no more free blocks in heap */
}